

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O0

Real __thiscall amrex::MultiFab::max(MultiFab *this,Box *region,int comp,int nghost,bool local)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  int in_EDX;
  byte in_R8B;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_double> *a;
  Box *bx;
  MFIter mfi;
  Real mx;
  undefined4 in_stack_fffffffffffffda8;
  MPI_Comm in_stack_fffffffffffffdac;
  MFIter *in_stack_fffffffffffffdb0;
  FabArray<amrex::FArrayBox> *this_00;
  undefined1 in_stack_fffffffffffffdd7;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  int iVar8;
  undefined4 in_stack_fffffffffffffde0;
  int iVar9;
  undefined4 in_stack_fffffffffffffde4;
  pointer in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  undefined1 local_1d8 [128];
  pointer local_158;
  MFIter local_150;
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> local_f0;
  byte local_e1;
  int local_dc;
  pointer local_c8;
  int local_c0;
  pointer local_b8;
  int local_ac;
  int iStack_a8;
  int local_a4;
  pointer local_a0;
  int local_98;
  pointer local_90;
  int local_84;
  int iStack_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  unique_ptr<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
  local_68;
  undefined4 local_5c;
  undefined1 *local_58;
  undefined4 local_4c;
  undefined1 *local_48;
  undefined4 local_3c;
  int *local_38;
  undefined4 local_2c;
  pointer local_28;
  undefined4 local_1c;
  pointer local_18;
  undefined4 local_c;
  pointer local_8;
  
  local_e1 = in_R8B & 1;
  local_dc = in_EDX;
  local_f0._M_head_impl = (FabArrayBase *)std::numeric_limits<double>::lowest();
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                 (FabArrayBase *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                 (bool)in_stack_fffffffffffffdd7);
  while (bVar6 = MFIter::isValid(&local_150), bVar6) {
    MFIter::growntilebox
              ((MFIter *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               (int)((ulong)in_stack_fffffffffffffe18 >> 0x20));
    Box::operator&((Box *)in_stack_fffffffffffffdb0,
                   (Box *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    local_158 = (pointer)(local_1d8 + 100);
    bVar6 = Box::ok((Box *)local_158);
    if (bVar6) {
      this_00 = (FabArray<amrex::FArrayBox> *)local_1d8;
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (this_00,in_stack_fffffffffffffdb0);
      local_b8 = local_158;
      local_8 = local_158;
      local_c = 0;
      iVar1 = *(int *)local_158;
      local_18 = local_158;
      local_1c = 1;
      iVar2 = *(int *)&local_158->field_0x4;
      in_stack_fffffffffffffe18 = *(pointer *)local_158;
      local_28 = local_158;
      local_2c = 2;
      local_90 = local_158;
      local_38 = (int *)((long)&local_158->_M_string_length + 4);
      local_3c = 0;
      iVar3 = *local_38;
      local_48 = (undefined1 *)((long)&local_158->_M_string_length + 4);
      local_4c = 1;
      iVar4 = *(int *)&local_158->field_2;
      local_a0 = *(pointer *)local_38;
      local_58 = (undefined1 *)((long)&local_158->_M_string_length + 4);
      local_5c = 2;
      iVar5 = *(int *)((long)&local_158->field_2 + 4);
      iVar7 = (int)local_158->_M_string_length;
      in_stack_fffffffffffffe20 = iVar7;
      local_1d8._64_8_ = this_00;
      local_c8 = in_stack_fffffffffffffe18;
      local_c0 = iVar7;
      local_ac = iVar1;
      iStack_a8 = iVar2;
      local_a4 = iVar7;
      local_98 = iVar5;
      local_84 = iVar3;
      iStack_80 = iVar4;
      local_7c = iVar5;
      for (; iVar9 = iVar2, iVar7 <= iVar5; iVar7 = iVar7 + 1) {
        for (; iVar8 = iVar1, iVar9 <= iVar4; iVar9 = iVar9 + 1) {
          for (; iVar8 <= iVar3; iVar8 = iVar8 + 1) {
            local_68._M_t.
            super___uniq_ptr_impl<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
            .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl =
                 (__uniq_ptr_data<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>,_true,_true>
                  )(__uniq_ptr_data<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>,_true,_true>
                    )local_1d8._64_8_;
            local_78 = local_dc;
            local_74 = iVar7;
            local_70 = iVar9;
            local_6c = iVar8;
            in_stack_fffffffffffffdb0 =
                 (MFIter *)
                 std::max<double>((double *)&local_f0,
                                  (double *)
                                  (*(long *)local_1d8._64_8_ +
                                  ((long)(iVar8 - *(int *)(local_1d8._64_8_ + 0x20)) +
                                   (long)(iVar9 - *(int *)(local_1d8._64_8_ + 0x24)) *
                                   *(long *)&((BoxArray *)(local_1d8._64_8_ + 8))->m_bat +
                                   (long)(iVar7 - *(int *)(local_1d8._64_8_ + 0x28)) *
                                   *(long *)(local_1d8._64_8_ + 0x10) +
                                  (long)local_dc * *(long *)(local_1d8._64_8_ + 0x18)) * 8));
            local_f0._M_head_impl =
                 (in_stack_fffffffffffffdb0->m_fa)._M_t.
                 super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                 .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
          }
        }
      }
    }
    MFIter::operator++(&local_150);
  }
  MFIter::~MFIter(in_stack_fffffffffffffdb0);
  if ((local_e1 & 1) == 0) {
    ParallelContext::CommunicatorSub();
    ParallelAllReduce::Max<double>((double *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
  }
  return (Real)local_f0._M_head_impl;
}

Assistant:

Real
MultiFab::max (const Box& region, int comp, int nghost, bool local) const
{
    BL_PROFILE("MultiFab::max(region)");

    Real mx = std::numeric_limits<Real>::lowest();

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& ma = this->const_arrays();
        mx = ParReduce(TypeList<ReduceOpMax>{}, TypeList<Real>{}, *this, IntVect(nghost),
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept -> GpuTuple<Real>
        {
            if (region.contains(i,j,k)) {
                return ma[box_no](i,j,k,comp);
            } else {
                return AMREX_REAL_LOWEST;
            }
        });
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(max:mx)
#endif
        for (MFIter mfi(*this,true); mfi.isValid(); ++mfi) {
            Box const& bx = mfi.growntilebox(nghost) & region;
            if (bx.ok()) {
                auto const& a = this->const_array(mfi);
                AMREX_LOOP_3D(bx, i, j, k,
                {
                    mx = std::max(mx, a(i,j,k,comp));
                });
            }
        }
    }

    if (!local) {
        ParallelAllReduce::Max(mx, ParallelContext::CommunicatorSub());
    }

    return mx;
}